

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandMfse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  Acb_Par_t Pars;
  Acb_Par_t local_78;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_40 = pAbc;
  local_38 = Abc_FrameReadNtk(pAbc);
  Acb_ParSetDefault(&local_78);
  Extra_UtilGetoptReset();
LAB_00251525:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"IOWFLCadvwh"), pAVar3 = local_38,
        iVar7 = globalUtilOptind, 0x56 < iVar1) {
    if (iVar1 < 100) {
      if (iVar1 == 0x57) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_002516de;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_78.nWinNodeMax = uVar2;
        goto LAB_0025165c;
      }
      piVar4 = &local_78.fArea;
      if (iVar1 != 0x61) goto switchD_00251546_caseD_47;
    }
    else {
      piVar4 = &local_78.fUseAshen;
      if ((iVar1 != 100) && (piVar4 = &local_78.fVerbose, iVar1 != 0x76)) {
        if (iVar1 != 0x77) goto switchD_00251546_caseD_47;
        piVar4 = &local_78.fVeryVerbose;
      }
    }
    *(byte *)piVar4 = (byte)*piVar4 ^ 1;
  }
  switch(iVar1) {
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_002516de:
      Abc_Print(-1,pcVar5);
      goto switchD_00251546_caseD_47;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_78.nFanoutMax = uVar2;
    break;
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
    goto switchD_00251546_caseD_47;
  case 0x49:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
      goto LAB_002516de;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_78.nTfiLevMax = uVar2;
    break;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_002516de;
    }
    local_78.nGrowthLevel = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar7 + 1;
    if (local_78.nGrowthLevel + 0xc46535ffU < 0x88ca6bff) {
switchD_00251546_caseD_47:
      Abc_Print(-2,"usage: mfse [-IOWFLC <num>] [-advwh]\n");
      Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
      Abc_Print(-2,"\t-I <num> : the number of levels in the TFI cone (2 <= num) [default = %d]\n",
                (ulong)(uint)local_78.nTfiLevMax);
      Abc_Print(-2,"\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
                (ulong)(uint)local_78.nTfoLevMax);
      Abc_Print(-2,"\t-W <num> : the max number of nodes in the window (1 <= num) [default = %d]\n",
                (ulong)(uint)local_78.nWinNodeMax);
      Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
                (ulong)(uint)local_78.nFanoutMax);
      Abc_Print(-2,
                "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
                ,(ulong)(uint)local_78.nGrowthLevel);
      Abc_Print(-2,
                "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
                ,(ulong)(uint)local_78.nBTLimit);
      pcVar5 = "area";
      if (local_78.fArea == 0) {
        pcVar5 = "delay";
      }
      Abc_Print(-2,"\t-a       : toggle minimizing area [default = %s]\n",pcVar5);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_78.fUseAshen == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle using Ashenhurst decomposition [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_78.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar5);
      if (local_78.fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",
                pcVar6);
      pcVar5 = "\t-h       : print the command usage\n";
      iVar7 = -2;
LAB_0025183b:
      Abc_Print(iVar7,pcVar5);
      return 1;
    }
    goto LAB_00251525;
  case 0x4f:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-O\" should be followed by an integer.\n";
      goto LAB_002516de;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_78.nTfoLevMax = uVar2;
    break;
  default:
    if (iVar1 != 0x43) {
      if (iVar1 == -1) {
        if (local_38 == (Abc_Ntk_t *)0x0) {
          pcVar5 = "Empty network.\n";
        }
        else if (local_38->ntkType == ABC_NTK_LOGIC) {
          local_78.nLutSize = Abc_NtkGetFaninMax(local_38);
          if (local_78.nLutSize < 7) {
            Abc_NtkToSop(pAVar3,-1,1000000000);
            pAVar3 = Abc_NtkOptMfse(pAVar3,&local_78);
            if (pAVar3 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(local_40,pAVar3);
              return 0;
            }
            pcVar5 = "Command \"mfse\" has failed.\n";
          }
          else {
            pcVar5 = "Command is only applicable to LUT size no more than 6.\n";
          }
        }
        else {
          pcVar5 = "This command can only be applied to a logic network.\n";
        }
        iVar7 = -1;
        goto LAB_0025183b;
      }
      goto switchD_00251546_caseD_47;
    }
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_002516de;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_78.nBTLimit = uVar2;
  }
LAB_0025165c:
  globalUtilOptind = iVar7 + 1;
  if ((int)uVar2 < 0) goto switchD_00251546_caseD_47;
  goto LAB_00251525;
}

Assistant:

int Abc_CommandMfse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkOptMfse( Abc_Ntk_t * pNtk, Acb_Par_t * pPars );
    Abc_Ntk_t * pNtkNew, * pNtk = Abc_FrameReadNtk(pAbc);
    Acb_Par_t Pars, * pPars = &Pars; int c;
    Acb_ParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IOWFLCadvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfiLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfiLevMax < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinNodeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinNodeMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < -ABC_INFINITY || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'd':
            pPars->fUseAshen ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    pPars->nLutSize = Abc_NtkGetFaninMax( pNtk );
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Command is only applicable to LUT size no more than 6.\n" );
        return 1;
    }
    Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
    pNtkNew = Abc_NtkOptMfse( pNtk, pPars );
    if ( pNtkNew == NULL )
    {
        Abc_Print( -1, "Command \"mfse\" has failed.\n" );
        return 1;
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: mfse [-IOWFLC <num>] [-advwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-I <num> : the number of levels in the TFI cone (2 <= num) [default = %d]\n",             pPars->nTfiLevMax );
    Abc_Print( -2, "\t-O <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-W <num> : the max number of nodes in the window (1 <= num) [default = %d]\n",            pPars->nWinNodeMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-a       : toggle minimizing area [default = %s]\n",                                      pPars->fArea? "area": "delay" );
    Abc_Print( -2, "\t-d       : toggle using Ashenhurst decomposition [default = %s]\n",                       pPars->fUseAshen? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}